

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnndec.c
# Opt level: O1

rnndecaddrinfo * rnndec_decodeaddr(rnndeccontext *ctx,rnndomain *domain,uint64_t addr,int write)

{
  rnndecaddrinfo *prVar1;
  uint in_stack_ffffffffffffffdc;
  int in_stack_ffffffffffffffe0;
  
  prVar1 = trymatch(ctx,domain->subelems,domain->subelemsnum,addr,domain->width,0,
                    (uint64_t *)((ulong)in_stack_ffffffffffffffdc << 0x20),in_stack_ffffffffffffffe0
                   );
  if (prVar1 == (rnndecaddrinfo *)0x0) {
    prVar1 = (rnndecaddrinfo *)calloc(0x18,1);
    asprintf(&prVar1->name,"%s%#lx%s",ctx->colors->err,addr,ctx->colors->reset);
  }
  return prVar1;
}

Assistant:

struct rnndecaddrinfo *rnndec_decodeaddr(struct rnndeccontext *ctx, struct rnndomain *domain, uint64_t addr, int write) {
	struct rnndecaddrinfo *res = trymatch(ctx, domain->subelems, domain->subelemsnum, addr, write, domain->width, 0, 0);
	if (res)
		return res;
	res = calloc (sizeof *res, 1);
	asprintf (&res->name, "%s%#"PRIx64"%s", ctx->colors->err, addr, ctx->colors->reset);
	return res;
}